

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ck_seg.c
# Opt level: O1

int ck_seg(acmod_set_t *acmod_set,acmod_id_t *phone,uint32 n_phone,uint16 *seg,uint32 n_frame,
          char *utt_name)

{
  acmod_id_t *paVar1;
  ushort uVar2;
  acmod_id_t id;
  char *pcVar3;
  uint uVar4;
  ulong uVar5;
  char *pcVar6;
  long ln;
  acmod_id_t id_00;
  ulong uVar7;
  uint32 uVar8;
  ulong uVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  
  if (n_phone == 0) {
    if (n_frame == 0) {
      return 0;
    }
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/ck_seg.c"
            ,0x47,"utt %s: No phones, but non-empty seg exists\n");
  }
  else {
    uVar2 = *seg;
    if ((short)uVar2 < 0) {
      id = acmod_set_base_phone(acmod_set,*phone);
      uVar7 = 1;
      uVar9 = 1;
      if (1 < n_frame) {
        uVar9 = (ulong)n_frame;
        uVar5 = 1;
        do {
          if ((short)seg[uVar5] < 0) {
            uVar9 = uVar5 & 0xffffffff;
            break;
          }
          uVar5 = uVar5 + 1;
        } while (n_frame != (uint32)uVar5);
      }
      id_00 = (uVar2 & 0x7fff) / 0x13;
      bVar11 = id == id_00;
      uVar8 = (uint32)uVar9;
      bVar10 = uVar8 < n_frame;
      bVar12 = n_phone != 1;
      if ((bVar10 && bVar12) && bVar11) {
        uVar7 = 1;
        do {
          uVar2 = seg[uVar9];
          paVar1 = phone + uVar7;
          uVar7 = uVar7 + 1;
          id = acmod_set_base_phone(acmod_set,*paVar1);
          uVar4 = (int)uVar9 + 1;
          if (uVar4 < n_frame) {
            uVar4 = n_frame;
          }
          do {
            if (uVar4 - 1 == (int)uVar9) {
              uVar9 = (ulong)uVar4;
              break;
            }
            uVar9 = (ulong)((int)uVar9 + 1);
          } while (-1 < (short)seg[uVar9]);
          id_00 = (uVar2 & 0x7fff) / 0x13;
          bVar11 = id == id_00;
          bVar12 = uVar7 < n_phone;
          uVar8 = (uint32)uVar9;
          bVar10 = uVar8 < n_frame;
        } while (((bVar10) && (id == id_00)) && (uVar7 < n_phone));
      }
      if (bVar11) {
        if ((bool)(bVar12 ^ 1U | uVar8 != n_frame)) {
          if ((bool)(bVar10 ^ 1U | (uint32)uVar7 != n_phone)) {
            return 0;
          }
          pcVar6 = "utt_name %s: seg phone seq longer than given phone seq\n";
          ln = 0x7e;
        }
        else {
          pcVar6 = "utt_name %s: seg phone seq shorter than given phone seq\n";
          ln = 0x75;
        }
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/ck_seg.c"
                ,ln,pcVar6,utt_name);
      }
      else {
        pcVar6 = acmod_set_id2name(acmod_set,id);
        pcVar3 = acmod_set_id2name(acmod_set,id_00);
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/ck_seg.c"
                ,0x6d,
                "utt %s: phone %u, %s, in transcript does not match phone %s in seg at frame %u\n",
                utt_name,(ulong)((uint32)uVar7 - 1),pcVar6,pcVar3,(ulong)(uVar8 - 1));
      }
    }
    else {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/ck_seg.c"
              ,0x4e,"utt %s: Expected beginning of phone indicator for at frame %u\n",utt_name,0);
    }
  }
  return -1;
}

Assistant:

int
ck_seg(acmod_set_t *acmod_set,
       acmod_id_t *phone,
       uint32 n_phone,
       uint16 *seg,
       uint32 n_frame,
       const char *utt_name)
{
    uint32	phone_i;
    uint32	seg_ci;
    acmod_id_t	trans_ci;
    uint32 f;
    uint32 n_state = MAX_N_STATE-1;	/* # of emitting states/model */

    if (n_phone == 0) {
	if (n_frame == 0) 
	    return S3_SUCCESS;
	else {
	    E_ERROR("utt %s: No phones, but non-empty seg exists\n");
	    return S3_ERROR;
	}
    }

    if ((seg[0] & 0x8000) == 0) {
	E_ERROR("utt %s: Expected beginning of phone indicator for at frame %u\n",
		utt_name, 0);

	return S3_ERROR;
    }

    phone_i = 0;
    f = 0;

    seg_ci = (seg[f++] & 0x7FFF) / n_state;
    trans_ci = acmod_set_base_phone(acmod_set, phone[phone_i++]);
    /* skip over non-begin frames */
    for (; ((f < n_frame) && ((seg[f] & 0x8000) == 0)); f++);

    while ((seg_ci == trans_ci) &&
	   (f < n_frame) &&
	   (phone_i < n_phone)) {
	
	seg_ci = (seg[f++] & 0x7FFF) / n_state;
	
	trans_ci = acmod_set_base_phone(acmod_set, phone[phone_i++]);
	
	/* skip over non-begin frames */
	for (; ((f < n_frame ) && ((seg[f] & 0x8000) == 0)); f++);
    }

    if (seg_ci != trans_ci) {
	E_ERROR("utt %s: phone %u, %s, in transcript does not match phone %s in seg at frame %u\n",
		utt_name,
		phone_i-1,
		acmod_set_id2name(acmod_set, trans_ci),
		acmod_set_id2name(acmod_set, seg_ci),
		f-1);
	
	return S3_ERROR;
    }

    if ((phone_i < n_phone) && (f == n_frame)) {
	/* i.e. got to end of seg sequence before end of phone seq */
	E_ERROR("utt_name %s: seg phone seq shorter than given phone seq\n",
		utt_name);
	
	return S3_ERROR;
    }

    if ((phone_i == n_phone) && (f < n_frame)) {
	/* i.e. got to end of phone sequence before end of seg seq */

	E_ERROR("utt_name %s: seg phone seq longer than given phone seq\n",
		utt_name);
	
	return S3_ERROR;
    }

    return S3_SUCCESS;
}